

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

void __thiscall TPZTensor<TFad<6,_double>_>::TPZDecomposed::Print(TPZDecomposed *this,ostream *out)

{
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  bool bVar8;
  
  poVar3 = std::operator<<(out,"TPZTensor::Decomposed Eigenvalues (");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," distinct):");
  std::endl<char,std::char_traits<char>>(poVar3);
  uVar2 = 0;
  uVar7 = 0;
  do {
    uVar1 = (this->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore[uVar2];
    poVar3 = std::operator<<(out,"Eigenvalue: ");
    poVar3 = ::operator<<(poVar3,(this->fEigenvalues).super_TPZVec<TFad<6,_double>_>.fStore + uVar2)
    ;
    poVar3 = std::operator<<(poVar3," (");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," time");
    pcVar6 = "";
    if (1 < uVar1) {
      pcVar6 = "s";
    }
    poVar3 = std::operator<<(poVar3,pcVar6);
    poVar3 = std::operator<<(poVar3,")");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(out,"Eigenvector");
    poVar3 = std::operator<<(poVar3,pcVar6);
    poVar3 = std::operator<<(poVar3,":");
    std::endl<char,std::char_traits<char>>(poVar3);
    if (((this->fEigenvectors).super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>.fNElements == 0) ||
       ((((this->fEigenvectors).super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>.fStore)->
        super_TPZVec<TFad<6,_double>_>).fNElements == 0)) {
      poVar3 = std::operator<<(out," Not computed.");
      std::endl<char,std::char_traits<char>>(poVar3);
      uVar4 = uVar7;
    }
    else {
      uVar4 = uVar1 + uVar7;
      uVar5 = uVar1;
      while (bVar8 = uVar5 != 0, uVar5 = uVar5 - 1, bVar8) {
        poVar3 = ::operator<<(out,(this->fEigenvectors).
                                  super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>.fStore[uVar7].
                                  super_TPZVec<TFad<6,_double>_>.fStore);
        std::operator<<(poVar3," ");
        poVar3 = ::operator<<(out,(this->fEigenvectors).
                                  super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>.fStore[uVar7].
                                  super_TPZVec<TFad<6,_double>_>.fStore + 1);
        std::operator<<(poVar3," ");
        poVar3 = ::operator<<(out,(this->fEigenvectors).
                                  super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>.fStore[uVar7].
                                  super_TPZVec<TFad<6,_double>_>.fStore + 2);
        std::endl<char,std::char_traits<char>>(poVar3);
        uVar7 = uVar7 + 1;
      }
    }
    uVar7 = uVar4;
    poVar3 = std::operator<<(out,"Eigentensor:");
    std::endl<char,std::char_traits<char>>(poVar3);
    TPZTensor<TFad<6,_double>_>::Print
              ((this->fEigentensors).super_TPZVec<TPZTensor<TFad<6,_double>_>_>.fStore + uVar2,out);
    std::endl<char,std::char_traits<char>>(out);
    uVar2 = uVar1 + uVar2;
  } while (uVar2 < 3);
  return;
}

Assistant:

void Print(std::ostream &out) const {
#ifdef PZ_LOG
            if (fDistinctEigenvalues == 0 || fDistinctEigenvalues > 3) {
                std::stringstream str;
                str << "TPZTensor::Decomposed::Print Invalid number of distinct eigenvalues: " << fDistinctEigenvalues << std::endl;
                LOGPZ_DEBUG(loggerr, str.str());
            }
#endif
            out << "TPZTensor::Decomposed Eigenvalues (" << fDistinctEigenvalues << " distinct):" << std::endl;
            unsigned int vIndex = 0;
            unsigned int lambda = 0;
            do {
                const unsigned int geoMult(fGeometricMultiplicity[lambda]);
#ifdef PZ_LOG
                if (geoMult == 0 || geoMult > 3) {
                    std::stringstream str;
                    str << "TPZTensor::Decomposed::Print Invalid geometric multiplicity (" << geoMult << ") for eigenvalue " << fEigenvalues[lambda] << std::endl;
                    LOGPZ_DEBUG(loggerr, str.str());
                }
#endif
                out << "Eigenvalue: " << fEigenvalues[lambda] << " (" << geoMult << " time" << (geoMult > 1 ? "s" : "") << ")" << std::endl;
                out << "Eigenvector" << (geoMult > 1 ? "s" : "") << ":" << std::endl;
                if (fEigenvectors.size() == 0 || fEigenvectors[0].size() == 0) {
                    out << " Not computed." << std::endl;
                } else {
                    for (unsigned int v = 0; v < geoMult; ++v) {
                        out << fEigenvectors[vIndex][0] << " ";
                        out << fEigenvectors[vIndex][1] << " ";
                        out << fEigenvectors[vIndex][2] << std::endl;
                        ++vIndex;
                    }
                }
                out << "Eigentensor:" << std::endl;
                fEigentensors[lambda].Print(out);
                out << std::endl;
                lambda += geoMult; // Go to next distinct eigenvalue
#ifdef PZDEBUG
                if (lambda > 3) {
                    std::stringstream str;
                    str << "TPZTensor::Decomposed::Print Total geometric multiplicity greater than expected!" << std::endl;
                    LOGPZ_ERROR(loggerr, str.str());
                }
#endif
            } while (lambda < 3);
        }